

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  uint uVar1;
  int iVar2;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int Ft_ext_1;
  int Ht_pre_1;
  int Ft_opn_1;
  int matval_1;
  int Ft_1;
  int Ft_ext;
  int Ht_pre;
  int Ft_opn;
  int matval;
  int Ft;
  int end_ref;
  int end_query;
  int score;
  int j;
  int i;
  int s1Len;
  int *Ht;
  int *HtB;
  int *E;
  int *H;
  int *HB;
  int *s2;
  int *s1;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  
  s2 = (int *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_bc = _s1Len;
    if (matrix->type != 0) {
      local_bc = matrix->length;
    }
    end_ref = -0x40000000;
    Ft = local_bc;
    _s1_local = (char *)parasail_result_new_table1(local_bc,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x1400202;
      uVar1 = 0;
      if (s1_beg != 0) {
        uVar1 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar1 | ((parasail_result_t *)_s1_local)->flag;
      uVar1 = 0;
      if (s1_end != 0) {
        uVar1 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar1 | ((parasail_result_t *)_s1_local)->flag;
      uVar1 = 0;
      if (s2_beg != 0) {
        uVar1 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar1 | ((parasail_result_t *)_s1_local)->flag;
      uVar1 = 0;
      if (s2_end != 0) {
        uVar1 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar1 | ((parasail_result_t *)_s1_local)->flag;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int(0x10,(long)s2Len);
      ptr_00 = parasail_memalign_int(0x10,(long)(local_bc + 1));
      ptr_01 = parasail_memalign_int(0x10,(long)local_bc);
      ptr_02 = parasail_memalign_int(0x10,(long)(local_bc + 1));
      if (ptr == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2 = parasail_memalign_int(0x10,(long)local_bc);
          if (s2 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (score = 0; score < local_bc; score = score + 1) {
            s2[score] = matrix->mapper[(byte)_s1[score]];
          }
        }
        for (end_query = 0; end_query < s2Len; end_query = end_query + 1) {
          ptr[end_query] = matrix->mapper[(byte)_s2[end_query]];
        }
        *ptr_00 = 0;
        *ptr_02 = 0;
        if (s1_beg == 0) {
          for (score = 0; score < local_bc; score = score + 1) {
            ptr_00[(long)score + 1] = -(score * gap) - open;
          }
        }
        else {
          for (score = 0; score < local_bc; score = score + 1) {
            ptr_00[(long)score + 1] = 0;
          }
        }
        for (score = 0; score < local_bc; score = score + 1) {
          ptr_01[score] = -0x40000000;
        }
        matval = s2Len;
        for (end_query = 0; end_query < s2Len + -1; end_query = end_query + 1) {
          Ft_opn = -0x40000000;
          for (score = 0; score < local_bc; score = score + 1) {
            if (ptr_00[(long)score + 1] - open < ptr_01[score] - gap) {
              local_c0 = ptr_01[score] - gap;
            }
            else {
              local_c0 = ptr_00[(long)score + 1] - open;
            }
            ptr_01[score] = local_c0;
          }
          for (score = 0; score < local_bc; score = score + 1) {
            if (matrix->type == 0) {
              local_c4 = matrix->matrix[matrix->size * s2[score] + ptr[end_query]];
            }
            else {
              local_c4 = matrix->matrix[matrix->size * score + ptr[end_query]];
            }
            if (ptr_01[score] < ptr_00[(long)(score + -1) + 1] + local_c4) {
              local_c8 = ptr_00[(long)(score + -1) + 1] + local_c4;
            }
            else {
              local_c8 = ptr_01[score];
            }
            ptr_02[(long)score + 1] = local_c8;
          }
          if (s2_beg == 0) {
            local_cc = -(end_query * gap) - open;
          }
          else {
            local_cc = 0;
          }
          *ptr_02 = local_cc;
          for (score = 0; score < local_bc; score = score + 1) {
            Ft_opn = Ft_opn - gap;
            if (Ft_opn <= ptr_02[(long)(score + -1) + 1]) {
              Ft_opn = ptr_02[(long)(score + -1) + 1];
            }
            local_d0 = Ft_opn - open;
            if (local_d0 < ptr_02[(long)score + 1]) {
              local_d0 = ptr_02[(long)score + 1];
            }
            ptr_00[(long)score + 1] = local_d0;
            ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row
            [score * s2Len + end_query] = ptr_00[(long)score + 1];
          }
          if (s2_beg == 0) {
            local_d4 = -(end_query * gap) - open;
          }
          else {
            local_d4 = 0;
          }
          *ptr_00 = local_d4;
          if ((s2_end != 0) && (end_ref < ptr_00[(long)(local_bc + -1) + 1])) {
            end_ref = ptr_00[(long)(local_bc + -1) + 1];
            Ft = local_bc + -1;
            matval = end_query;
          }
        }
        iVar2 = s2Len + -1;
        Ft_opn_1 = -0x40000000;
        for (score = 0; score < local_bc; score = score + 1) {
          if (ptr_00[(long)score + 1] - open < ptr_01[score] - gap) {
            local_d8 = ptr_01[score] - gap;
          }
          else {
            local_d8 = ptr_00[(long)score + 1] - open;
          }
          ptr_01[score] = local_d8;
        }
        for (score = 0; score < local_bc; score = score + 1) {
          if (matrix->type == 0) {
            local_dc = matrix->matrix[matrix->size * s2[score] + ptr[iVar2]];
          }
          else {
            local_dc = matrix->matrix[matrix->size * score + ptr[iVar2]];
          }
          if (ptr_01[score] < ptr_00[(long)(score + -1) + 1] + local_dc) {
            local_e0 = ptr_00[(long)(score + -1) + 1] + local_dc;
          }
          else {
            local_e0 = ptr_01[score];
          }
          ptr_02[(long)score + 1] = local_e0;
        }
        if (s2_beg == 0) {
          local_e4 = -(iVar2 * gap) - open;
        }
        else {
          local_e4 = 0;
        }
        *ptr_02 = local_e4;
        for (score = 0; score < local_bc; score = score + 1) {
          Ft_opn_1 = Ft_opn_1 - gap;
          if (Ft_opn_1 <= ptr_02[(long)(score + -1) + 1]) {
            Ft_opn_1 = ptr_02[(long)(score + -1) + 1];
          }
          local_e8 = Ft_opn_1 - open;
          if (local_e8 < ptr_02[(long)score + 1]) {
            local_e8 = ptr_02[(long)score + 1];
          }
          ptr_00[(long)score + 1] = local_e8;
          ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row[score * s2Len + iVar2] =
               ptr_00[(long)score + 1];
          if ((s1_end != 0) && (end_ref < ptr_00[(long)score + 1])) {
            end_ref = ptr_00[(long)score + 1];
            Ft = score;
            matval = iVar2;
          }
        }
        if ((s2_end != 0) && (end_ref < ptr_00[(long)(local_bc + -1) + 1])) {
          end_ref = ptr_00[(long)(local_bc + -1) + 1];
          Ft = local_bc + -1;
          matval = s2Len + -1;
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          end_ref = ptr_00[(long)(local_bc + -1) + 1];
          Ft = local_bc + -1;
          matval = s2Len + -1;
        }
        ((parasail_result_t *)_s1_local)->score = end_ref;
        ((parasail_result_t *)_s1_local)->end_query = Ft;
        ((parasail_result_t *)_s1_local)->end_ref = matval;
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_col[i] = H[i];
#endif
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}